

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O2

int stbi__get16le(stbi__context *s)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  
  sVar1 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  return (uint)CONCAT11(sVar2,sVar1);
}

Assistant:

static int stbi__get16le(stbi__context *s)
{
   int z = stbi__get8(s);
   return z + (stbi__get8(s) << 8);
}